

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

cio_error stream_write(cio_io_stream *stream,cio_write_buffer *buffer,
                      cio_io_stream_write_handler_t handler,void *handler_context)

{
  size_t sVar1;
  ssize_t sVar2;
  int *piVar3;
  bool bVar4;
  ssize_t ret;
  size_t i;
  size_t sStack_50;
  _Bool write_error;
  size_t written;
  cio_write_buffer *write_buffer;
  size_t chain_length;
  cio_uart *uart;
  void *handler_context_local;
  cio_io_stream_write_handler_t handler_local;
  cio_write_buffer *buffer_local;
  cio_io_stream *stream_local;
  
  bVar4 = true;
  if ((stream != (cio_io_stream *)0x0) && (bVar4 = true, buffer != (cio_write_buffer *)0x0)) {
    bVar4 = handler == (cio_io_stream_write_handler_t)0x0;
  }
  if (bVar4) {
    stream_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    sVar1 = cio_write_buffer_get_num_buffer_elements(buffer);
    written = (size_t)buffer->next;
    sStack_50 = 0;
    bVar4 = false;
    for (ret = 0; (ulong)ret < sVar1; ret = ret + 1) {
      sVar2 = write(*(int *)&stream[0x3a].read_handler_context,*(void **)(written + 0x10),
                    *(size_t *)(written + 0x18));
      if (sVar2 < 0) {
        bVar4 = true;
        break;
      }
      sStack_50 = sVar2 + sStack_50;
      if (sVar2 != *(long *)(written + 0x18)) break;
      written = *(size_t *)written;
    }
    if (bVar4) {
      piVar3 = __errno_location();
      if (*piVar3 == 0xb) {
        stream->write_handler = handler;
        stream->write_handler_context = handler_context;
        stream->write_buffer = buffer;
        stream[0x3a].read_handler = (cio_io_stream_read_handler_t)stream;
        stream[0x3a].close = write_callback;
        stream_local._4_4_ =
             cio_linux_eventloop_register_write
                       ((cio_eventloop *)stream[0x3a].read_buffer,
                        (cio_event_notifier *)&stream[0x3a].write_some);
      }
      else {
        piVar3 = __errno_location();
        stream_local._4_4_ = -*piVar3;
      }
    }
    else {
      (*handler)(stream,handler_context,buffer,CIO_SUCCESS,sStack_50);
      stream_local._4_4_ = CIO_SUCCESS;
    }
  }
  return stream_local._4_4_;
}

Assistant:

static enum cio_error stream_write(struct cio_io_stream *stream, struct cio_write_buffer *buffer, cio_io_stream_write_handler_t handler, void *handler_context)
{
	if (cio_unlikely((stream == NULL) || (buffer == NULL) || (handler == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	struct cio_uart *uart = cio_container_of(stream, struct cio_uart, stream);
	size_t chain_length = cio_write_buffer_get_num_buffer_elements(buffer);

	const struct cio_write_buffer *write_buffer = buffer->next;
	size_t written = 0;
	bool write_error = false;
	for (size_t i = 0; i < chain_length; i++) {
		ssize_t ret = write(uart->impl.ev.fd, write_buffer->data.element.data, write_buffer->data.element.length);
		if (cio_likely(ret >= 0)) {
			written += (size_t)ret;
			if ((size_t)ret != write_buffer->data.element.length) {
				break;
			}
		} else {
			write_error = true;
			break;
		}

		write_buffer = write_buffer->next;
	}

	if (cio_likely(!write_error)) {
		handler(stream, handler_context, buffer, CIO_SUCCESS, written);
		return CIO_SUCCESS;
	}

	if (cio_likely(errno == EAGAIN)) {
		uart->stream.write_handler = handler;
		uart->stream.write_handler_context = handler_context;
		uart->stream.write_buffer = buffer;
		uart->impl.ev.context = stream;
		uart->impl.ev.write_callback = write_callback;
		return cio_linux_eventloop_register_write(uart->impl.loop, &uart->impl.ev);
	}

	return (enum cio_error)(-errno);
}